

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_NtkCreateFanout(Acb_Ntk_t *p)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int local_14;
  int iObj;
  Acb_Ntk_t *p_local;
  
  Acb_NtkCleanObjFanout(p);
  for (local_14 = 1; iVar1 = Vec_StrSize(&p->vObjType), local_14 < iVar1; local_14 = local_14 + 1) {
    AVar2 = Acb_ObjType(p,local_14);
    if (AVar2 != ABC_OPER_NONE) {
      Acb_ObjAddFaninFanout(p,local_14);
    }
  }
  return;
}

Assistant:

static inline void Acb_NtkCreateFanout( Acb_Ntk_t * p )
{
    int iObj; 
    Acb_NtkCleanObjFanout( p );
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjAddFaninFanout( p, iObj );
}